

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

lws_protocol_vhost_options * lws_vhost_protocol_options(lws_vhost *vh,char *name)

{
  int iVar1;
  lws_protocol_vhost_options *local_28;
  lws_protocol_vhost_options *pvo;
  char *name_local;
  lws_vhost *vh_local;
  
  local_28 = vh->pvo;
  if (name != (char *)0x0) {
    for (; local_28 != (lws_protocol_vhost_options *)0x0; local_28 = local_28->next) {
      iVar1 = strcmp(local_28->name,name);
      if (iVar1 == 0) {
        return local_28;
      }
    }
  }
  return (lws_protocol_vhost_options *)0x0;
}

Assistant:

const struct lws_protocol_vhost_options *
lws_vhost_protocol_options(struct lws_vhost *vh, const char *name)
{
	const struct lws_protocol_vhost_options *pvo = vh->pvo;

	if (!name)
		return NULL;

	while (pvo) {
		if (!strcmp(pvo->name, name))
			return pvo;
		pvo = pvo->next;
	}

	return NULL;
}